

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  uint uVar1;
  size_t code;
  int bmi2_local;
  HUF_CElt *CTable_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstSize_local;
  void *dst_local;
  size_t initErr;
  BIT_CStream_t bitC;
  size_t n;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *ip;
  size_t local_b8;
  
  if (dstSize < 8) {
    local_b8 = 0;
  }
  else {
    code = BIT_initCStream((BIT_CStream_t *)&initErr,dst,dstSize);
    uVar1 = ERR_isError(code);
    if (uVar1 == 0) {
      bitC.endPtr = (char *)(srcSize & 0xfffffffffffffffc);
      switch((uint)srcSize & 3) {
      case 3:
        BIT_addBitsFast((BIT_CStream_t *)&initErr,
                        (ulong)CTable[(uint)(byte)bitC.endPtr[(long)src + 2]].val,
                        (uint)CTable[(uint)(byte)bitC.endPtr[(long)src + 2]].nbBits);
      case 2:
        BIT_addBitsFast((BIT_CStream_t *)&initErr,
                        (ulong)CTable[(uint)(byte)bitC.endPtr[(long)src + 1]].val,
                        (uint)CTable[(uint)(byte)bitC.endPtr[(long)src + 1]].nbBits);
      case 1:
        BIT_addBitsFast((BIT_CStream_t *)&initErr,
                        (ulong)CTable[(uint)*(byte *)((long)src + (long)bitC.endPtr)].val,
                        (uint)CTable[(uint)*(byte *)((long)src + (long)bitC.endPtr)].nbBits);
        BIT_flushBits((BIT_CStream_t *)&initErr);
      case 0:
      default:
        for (; bitC.endPtr != (char *)0x0; bitC.endPtr = bitC.endPtr + -4) {
          BIT_addBitsFast((BIT_CStream_t *)&initErr,
                          (ulong)CTable[(uint)*(byte *)((long)src + (long)(bitC.endPtr + -1))].val,
                          (uint)CTable[(uint)*(byte *)((long)src + (long)(bitC.endPtr + -1))].nbBits
                         );
          BIT_addBitsFast((BIT_CStream_t *)&initErr,
                          (ulong)CTable[(uint)*(byte *)((long)src + (long)(bitC.endPtr + -2))].val,
                          (uint)CTable[(uint)*(byte *)((long)src + (long)(bitC.endPtr + -2))].nbBits
                         );
          BIT_addBitsFast((BIT_CStream_t *)&initErr,
                          (ulong)CTable[(uint)*(byte *)((long)src + (long)(bitC.endPtr + -3))].val,
                          (uint)CTable[(uint)*(byte *)((long)src + (long)(bitC.endPtr + -3))].nbBits
                         );
          BIT_addBitsFast((BIT_CStream_t *)&initErr,
                          (ulong)CTable[(uint)*(byte *)((long)src + (long)(bitC.endPtr + -4))].val,
                          (uint)CTable[(uint)*(byte *)((long)src + (long)(bitC.endPtr + -4))].nbBits
                         );
          BIT_flushBits((BIT_CStream_t *)&initErr);
        }
        local_b8 = BIT_closeCStream((BIT_CStream_t *)&initErr);
      }
    }
    else {
      local_b8 = 0;
    }
  }
  return local_b8;
}

Assistant:

static size_t
HUF_compress1X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, const int bmi2)
{
    (void)bmi2;
    return HUF_compress1X_usingCTable_internal_body(dst, dstSize, src, srcSize, CTable);
}